

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS ref_oct_unique_nodes(REF_OCT ref_oct,REF_NODE ref_node)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  lVar2 = (long)ref_oct->nnode;
  if (lVar2 == 0) {
    lVar2 = (long)ref_node->n;
    if (lVar2 == 0) {
      uVar1 = ref_oct_unique_corner_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
      if (uVar1 == 0) {
        uVar1 = ref_oct_unique_face_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
        if (uVar1 == 0) {
          uVar1 = ref_oct_unique_center_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
          if (uVar1 == 0) {
            uVar1 = ref_node_initialize_n_global(ref_node,(long)ref_oct->nnode);
            if (uVar1 == 0) {
              return 0;
            }
            pcVar4 = "init glob";
            uVar3 = 0x19b;
          }
          else {
            pcVar4 = "center node descend";
            uVar3 = 0x199;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 uVar3,"ref_oct_unique_nodes",(ulong)uVar1,pcVar4);
          return uVar1;
        }
        pcVar4 = "face node descend";
        uVar3 = 0x197;
      }
      else {
        pcVar4 = "corner node descend";
        uVar3 = 0x195;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar3,
             "ref_oct_unique_nodes",(ulong)uVar1,pcVar4);
      return uVar1;
    }
    pcVar4 = "expected zero grid nodes";
    uVar3 = 0x193;
  }
  else {
    pcVar4 = "expected zero oct nodes";
    uVar3 = 0x192;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar3,
         "ref_oct_unique_nodes",pcVar4,0,lVar2);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_oct_unique_nodes(REF_OCT ref_oct, REF_NODE ref_node) {
  REIS(0, ref_oct_nnode(ref_oct), "expected zero oct nodes");
  REIS(0, ref_node_n(ref_node), "expected zero grid nodes");
  RSS(ref_oct_unique_corner_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "corner node descend");
  RSS(ref_oct_unique_face_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "face node descend");
  RSS(ref_oct_unique_center_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "center node descend");
  RSS(ref_node_initialize_n_global(ref_node, ref_oct_nnode(ref_oct)),
      "init glob");
  return REF_SUCCESS;
}